

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

bool __thiscall
spirv_cross::Compiler::get_binary_offset_for_decoration
          (Compiler *this,VariableID id,Decoration decoration,uint32_t *word_offset)

{
  ulong uVar1;
  Meta *pMVar2;
  _Hash_node_base *p_Var3;
  ulong uVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  bool bVar7;
  
  pMVar2 = ParsedIR::find_meta(&this->ir,(ID)id.id);
  if (pMVar2 == (Meta *)0x0) {
    bVar7 = false;
  }
  else {
    uVar1 = (pMVar2->decoration_word_offset)._M_h._M_bucket_count;
    uVar4 = (ulong)decoration % uVar1;
    p_Var5 = (pMVar2->decoration_word_offset)._M_h._M_buckets[uVar4];
    p_Var6 = (__node_base_ptr)0x0;
    if ((p_Var5 != (__node_base_ptr)0x0) &&
       (p_Var3 = p_Var5->_M_nxt, p_Var6 = p_Var5,
       *(Decoration *)&p_Var5->_M_nxt[1]._M_nxt != decoration)) {
      while (p_Var5 = p_Var3, p_Var3 = p_Var5->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
        p_Var6 = (__node_base_ptr)0x0;
        if (((ulong)*(Decoration *)&p_Var3[1]._M_nxt % uVar1 != uVar4) ||
           (p_Var6 = p_Var5, *(Decoration *)&p_Var3[1]._M_nxt == decoration)) goto LAB_00335f2f;
      }
      p_Var6 = (__node_base_ptr)0x0;
    }
LAB_00335f2f:
    if (p_Var6 == (__node_base_ptr)0x0) {
      p_Var3 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var3 = p_Var6->_M_nxt;
    }
    bVar7 = p_Var3 != (_Hash_node_base *)0x0;
    if (bVar7) {
      *word_offset = *(uint32_t *)((long)&p_Var3[1]._M_nxt + 4);
    }
  }
  return bVar7;
}

Assistant:

bool Compiler::get_binary_offset_for_decoration(VariableID id, spv::Decoration decoration, uint32_t &word_offset) const
{
	auto *m = ir.find_meta(id);
	if (!m)
		return false;

	auto &word_offsets = m->decoration_word_offset;
	auto itr = word_offsets.find(decoration);
	if (itr == end(word_offsets))
		return false;

	word_offset = itr->second;
	return true;
}